

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O2

bool __thiscall
ImGuiWS::setTexture(ImGuiWS *this,TextureId textureId,Type textureType,int32_t width,int32_t height,
                   char *data)

{
  _Rb_tree_color _Var1;
  pointer pcVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  _Rb_tree_color *p_Var5;
  _Base_ptr p_Var6;
  mapped_type *this_00;
  _Head_base<0UL,_ImGuiWS::Impl_*,_false> _Var7;
  int iVar8;
  size_t __n;
  TextureId textureId_local;
  int local_58;
  int32_t local_54;
  int32_t local_50;
  Type local_4c;
  unique_lock<std::shared_mutex> lock;
  
  iVar8 = 4;
  if (textureType != RGBA32) {
    iVar8 = (uint)(textureType == RGB24) * 2 + 1;
  }
  textureId_local = textureId;
  local_4c = textureType;
  iVar3 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ImGuiWS::Texture>,_std::_Select1st<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
          ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ImGuiWS::Texture>,_std::_Select1st<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                  *)((long)&((this->m_impl)._M_t.
                             super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                             .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->dataWrite
                    + 0x30),&textureId_local);
  _Var7._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  if ((_Rb_tree_header *)iVar3._M_node ==
      (_Rb_tree_header *)((long)&(_Var7._M_head_impl)->dataWrite + 0x38U)) {
    local_58 = iVar8;
    local_54 = width;
    local_50 = height;
    pmVar4 = std::
             map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
             ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                           *)((long)&(_Var7._M_head_impl)->dataWrite + 0x30),&textureId_local);
    pmVar4->revision = 0;
    pmVar4 = std::
             map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
             ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                           *)((long)&((this->m_impl)._M_t.
                                      super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                      .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                     dataWrite + 0x30),&textureId_local);
    pcVar2 = (pmVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pmVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar2) {
      (pmVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = pcVar2;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             *)&((this->m_impl)._M_t.
                 super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
                 super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
                 super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->dataWrite);
    _Var7._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
         super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
         super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
    p_Var6 = *(_Base_ptr *)((long)&(_Var7._M_head_impl)->dataWrite + 0x48);
    iVar8 = 0;
    while (p_Var6 != (_Rb_tree_node_base *)((long)&(_Var7._M_head_impl)->dataWrite + 0x38U)) {
      _Var1 = p_Var6[1]._M_color;
      lock._M_device._0_4_ = iVar8;
      p_Var5 = std::
               map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               ::operator[](&(((this->m_impl)._M_t.
                               super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                               .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                             dataWrite).textureIdMap,(key_type *)&lock);
      *p_Var5 = _Var1;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      iVar8 = iVar8 + 1;
    }
    _Var7._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
         super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
         super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
    height = local_50;
    width = local_54;
    iVar8 = local_58;
  }
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[](&((_Var7._M_head_impl)->dataWrite).textures,&textureId_local);
  pmVar4->revision = pmVar4->revision + 1;
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&textureId_local);
  __n = (size_t)(height * width * iVar8);
  std::vector<char,_std::allocator<char>_>::resize(&pmVar4->data,__n + 0x14);
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&textureId_local);
  iVar8 = pmVar4->revision;
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&textureId_local);
  *(TextureId *)
   (pmVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
   _M_start = textureId_local;
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&textureId_local);
  *(Type *)((pmVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 4) = local_4c;
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&textureId_local);
  *(int32_t *)
   ((pmVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start + 8) = width;
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&textureId_local);
  *(int32_t *)
   ((pmVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start + 0xc) = height;
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&textureId_local);
  *(int *)((pmVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x10) = iVar8;
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&textureId_local);
  memcpy((pmVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x14,data,__n);
  std::unique_lock<std::shared_mutex>::unique_lock
            (&lock,&((this->m_impl)._M_t.
                     super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
                     super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
                     super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->mutex);
  pmVar4 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&textureId_local);
  this_00 = std::
            map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
            ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                          *)((long)&((this->m_impl)._M_t.
                                     super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                     .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                    dataRead + 0x30),&textureId_local);
  Texture::operator=(this_00,pmVar4);
  _Var7._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               *)&(_Var7._M_head_impl)->dataRead,
              (_Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               *)&(_Var7._M_head_impl)->dataWrite);
  std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
  return true;
}

Assistant:

bool ImGuiWS::setTexture(TextureId textureId, Texture::Type textureType, int32_t width, int32_t height, const char * data) {
    int bpp = 1; // bytes per pixel
    switch (textureType) {
        case Texture::Type::Alpha8: bpp = 1; break;
        case Texture::Type::Gray8:  bpp = 1; break;
        case Texture::Type::RGB24:  bpp = 3; break;
        case Texture::Type::RGBA32: bpp = 4; break;
    };

    if (m_impl->dataWrite.textures.find(textureId) == m_impl->dataWrite.textures.end()) {
        m_impl->dataWrite.textures[textureId].revision = 0;
        m_impl->dataWrite.textures[textureId].data.clear();
        m_impl->dataWrite.textureIdMap.clear();

        int idx = 0;
        for (const auto & t : m_impl->dataWrite.textures) {
            m_impl->dataWrite.textureIdMap[idx++] = t.first;
        }
    }

    m_impl->dataWrite.textures[textureId].revision++;
    m_impl->dataWrite.textures[textureId].data.resize(sizeof(TextureId) + sizeof(Texture::Type) + 3*sizeof(int32_t) + bpp*width*height);

    int revision = m_impl->dataWrite.textures[textureId].revision;

    size_t offset = 0;
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &textureId, sizeof(textureId)); offset += sizeof(textureId);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &textureType, sizeof(textureType)); offset += sizeof(textureType);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &width, sizeof(width)); offset += sizeof(width);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &height, sizeof(height)); offset += sizeof(height);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &revision, sizeof(revision)); offset += sizeof(revision);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, data, bpp*width*height);

    {
        std::unique_lock lock(m_impl->mutex);
        m_impl->dataRead.textures[textureId] = m_impl->dataWrite.textures[textureId];
        m_impl->dataRead.textureIdMap = m_impl->dataWrite.textureIdMap;
    }

    return true;
}